

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O0

Graph * Omega_h::edges_across_tris(Graph *__return_storage_ptr__,Adj *f2e,Adj *e2f)

{
  int size_in;
  char *file;
  Write<int> local_2d0;
  Read<int> local_2c0;
  Read<int> local_2b0;
  Adj local_2a0;
  undefined1 local_270 [8];
  type functor;
  string local_208 [32];
  undefined1 local_1e8 [8];
  Write<int> ee2e;
  int nee;
  Read<int> local_1b0;
  undefined1 local_1a0 [8];
  LOs e2ee;
  undefined1 local_180 [8];
  Read<int> e2ee_degrees;
  string local_168 [32];
  Read<int> local_148;
  undefined1 local_138 [8];
  LOs e2ef_degrees;
  undefined1 local_120 [4];
  int ne;
  Read<signed_char> e2ef_codes;
  LOs ef2f;
  LOs e2ef;
  LOs fe2e;
  allocator local_a9;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [39];
  ScopedTimer local_41;
  Adj *pAStack_40;
  ScopedTimer omega_h_scoped_function_timer;
  Adj *e2f_local;
  Adj *f2e_local;
  ulong local_10;
  
  pAStack_40 = e2f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,&local_a9);
  std::operator+(local_88,(char *)local_a8);
  std::__cxx11::to_string((__cxx11 *)&fe2e.write_.shared_alloc_.direct_ptr,0x215);
  std::operator+(local_68,local_88);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_41,"edges_across_tris",file);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&fe2e.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  Read<int>::Read((Read<int> *)&e2ef.write_.shared_alloc_.direct_ptr,&(f2e->super_Graph).ab2b);
  Read<int>::Read((Read<int> *)&ef2f.write_.shared_alloc_.direct_ptr,(Read<int> *)e2f);
  Read<int>::Read((Read<int> *)&e2ef_codes.write_.shared_alloc_.direct_ptr,&(e2f->super_Graph).ab2b)
  ;
  Read<signed_char>::Read((Read<signed_char> *)local_120,&e2f->codes);
  if (((ulong)ef2f.write_.shared_alloc_.direct_ptr & 1) == 0) {
    local_10 = *ef2f.write_.shared_alloc_.direct_ptr;
  }
  else {
    local_10 = (ulong)ef2f.write_.shared_alloc_.direct_ptr >> 3;
  }
  e2ef_degrees.write_.shared_alloc_.direct_ptr._4_4_ = (int)(local_10 >> 2) + -1;
  Read<int>::Read(&local_148,(Read<int> *)&ef2f.write_.shared_alloc_.direct_ptr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_168,"",(allocator *)((long)&e2ee_degrees.write_.shared_alloc_.direct_ptr + 7));
  get_degrees((Omega_h *)local_138,&local_148,(string *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&e2ee_degrees.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::~Read(&local_148);
  Read<int>::Read((Read<int> *)&e2ee.write_.shared_alloc_.direct_ptr,(Read<int> *)local_138);
  multiply_each_by<int>((Omega_h *)local_180,(Read<int> *)&e2ee.write_.shared_alloc_.direct_ptr,2);
  Read<int>::~Read((Read<int> *)&e2ee.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_1b0,(Read<int> *)local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&nee,"edges to edge edges",
             (allocator *)((long)&ee2e.shared_alloc_.direct_ptr + 7));
  offset_scan<int>((Omega_h *)local_1a0,&local_1b0,(string *)&nee);
  std::__cxx11::string::~string((string *)&nee);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ee2e.shared_alloc_.direct_ptr + 7));
  Read<int>::~Read(&local_1b0);
  size_in = Read<int>::last((Read<int> *)local_1a0);
  ee2e.shared_alloc_.direct_ptr._0_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_208,"edge edges to edges",
             (allocator *)((long)&functor.ee2e.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)local_1e8,size_in,(string *)local_208);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&functor.ee2e.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)local_270,(Read<int> *)&ef2f.write_.shared_alloc_.direct_ptr);
  Read<int>::Read((Read<int> *)&functor.e2ef.write_.shared_alloc_.direct_ptr,(Read<int> *)local_1a0)
  ;
  Read<int>::Read((Read<int> *)&functor.e2ee.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&e2ef_codes.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&functor.ef2f.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_120);
  Read<int>::Read((Read<int> *)&functor.e2ef_codes.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&e2ef.write_.shared_alloc_.direct_ptr);
  Write<int>::Write((Write<int> *)&functor.fe2e.write_.shared_alloc_.direct_ptr,
                    (Write<int> *)local_1e8);
  parallel_for<Omega_h::edges_across_tris(Omega_h::Adj,Omega_h::Adj)::__0>
            (e2ef_degrees.write_.shared_alloc_.direct_ptr._4_4_,(type *)local_270);
  Read<int>::Read(&local_2b0,(Read<int> *)local_1a0);
  Write<int>::Write(&local_2d0,(Write<int> *)local_1e8);
  Read<int>::Read(&local_2c0,&local_2d0);
  Adj::Adj(&local_2a0,&local_2b0,&local_2c0);
  Graph::Graph(__return_storage_ptr__,&local_2a0.super_Graph);
  Adj::~Adj(&local_2a0);
  Read<int>::~Read(&local_2c0);
  Write<int>::~Write(&local_2d0);
  Read<int>::~Read(&local_2b0);
  edges_across_tris(Omega_h::Adj,Omega_h::Adj)::$_0::~__0((__0 *)local_270);
  Write<int>::~Write((Write<int> *)local_1e8);
  Read<int>::~Read((Read<int> *)local_1a0);
  Read<int>::~Read((Read<int> *)local_180);
  Read<int>::~Read((Read<int> *)local_138);
  Read<signed_char>::~Read((Read<signed_char> *)local_120);
  Read<int>::~Read((Read<int> *)&e2ef_codes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&ef2f.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read((Read<int> *)&e2ef.write_.shared_alloc_.direct_ptr);
  ScopedTimer::~ScopedTimer(&local_41);
  return __return_storage_ptr__;
}

Assistant:

Graph edges_across_tris(Adj const f2e, Adj const e2f) {
  OMEGA_H_TIME_FUNCTION;
  auto const fe2e = f2e.ab2b;
  auto const e2ef = e2f.a2ab;
  auto const ef2f = e2f.ab2b;
  auto const e2ef_codes = e2f.codes;
  auto const ne = e2ef.size() - 1;
  auto const e2ef_degrees = get_degrees(e2ef);
  auto const e2ee_degrees = multiply_each_by(e2ef_degrees, 2);
  auto const e2ee = offset_scan(e2ee_degrees, "edges to edge edges");
  auto const nee = e2ee.last();
  Write<LO> ee2e(nee, "edge edges to edges");
  auto functor = OMEGA_H_LAMBDA(LO e) {
    auto const ef_begin = e2ef[e];
    auto const ef_end = e2ef[e + 1];
    auto const neef = ef_end - ef_begin;
    auto const ee_begin = e2ee[e];
    for (Int eef = 0; eef < neef; ++eef) {
      auto const ef = ef_begin + eef;
      auto const f = ef2f[ef];
      auto const e2ef_code = e2ef_codes[ef];
      auto const ffe = code_which_down(e2ef_code);
      auto const e1 = fe2e[f * 3 + ((ffe + 1) % 3)];
      auto const e2 = fe2e[f * 3 + ((ffe + 2) % 3)];
      ee2e[ee_begin + eef * 2 + 0] = e1;
      ee2e[ee_begin + eef * 2 + 1] = e2;
    }
  };
  parallel_for(ne, std::move(functor));
  return Adj(e2ee, ee2e);
}